

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O2

void printFlagBitsJSON(uint32_t indent,char *nl,uint32_t flags,
                      _func_char_ptr_uint32_t__Bool *toStringFn)

{
  bool bVar1;
  char *pcVar2;
  uint8_t *puVar3;
  uint uVar4;
  char *pcVar5;
  uint32_t bit_index;
  uint uVar6;
  
  bVar1 = true;
  for (uVar6 = 0; uVar6 != 0x20; uVar6 = uVar6 + 1) {
    uVar4 = 1 << ((byte)uVar6 & 0x1f);
    pcVar2 = (*toStringFn)(uVar6,(flags >> (uVar6 & 0x1f) & 1) != 0);
    if (pcVar2 == (char *)0x0) {
      if ((uVar4 & flags) != 0) {
        pcVar2 = ",";
        puVar3 = (uint8_t *)nl;
        if (bVar1) {
          pcVar2 = "";
          puVar3 = "";
        }
        bVar1 = false;
        printf("%s%s%*s%u",pcVar2,puVar3,(ulong)indent,"",(ulong)uVar4);
      }
    }
    else {
      pcVar5 = ",";
      puVar3 = (uint8_t *)nl;
      if (bVar1) {
        pcVar5 = "";
        puVar3 = "";
      }
      bVar1 = false;
      printf("%s%s%*s\"%s\"",pcVar5,puVar3,(ulong)indent,"",pcVar2);
    }
  }
  if (!bVar1) {
    printf("%s",nl);
    return;
  }
  return;
}

Assistant:

static void printFlagBitsJSON(uint32_t indent, const char* nl, uint32_t flags, const char*(*toStringFn)(uint32_t, bool)) {
    bool first = true;
    for (uint32_t bit_index = 0; bit_index < 32; ++bit_index) {
        uint32_t bit_mask = 1u << bit_index;
        bool bit_value = (bit_mask & (uint32_t) flags) != 0;

        const char* str = toStringFn(bit_index, bit_value);
        if (str) {
            printf("%s%s%*s\"%s\"", first ? "" : ",", first ? "" : nl, indent, "", str);
            first = false;
        } else if (bit_value) {
            printf("%s%s%*s%u", first ? "" : ",", first ? "" : nl, indent, "", bit_mask);
            first = false;
        }
    }
    if (!first)
        printf("%s", nl);
}